

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRaycastVehicle.cpp
# Opt level: O1

void __thiscall btRaycastVehicle::updateVehicle(btRaycastVehicle *this,btScalar step)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  btRigidBody *pbVar11;
  btWheelInfo *pbVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  float fVar16;
  btScalar deltaTime;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  btVector3 relpos;
  btVector3 impulse;
  btVector3 local_50;
  btVector3 local_40;
  
  if (0 < (this->m_wheelInfo).m_size) {
    iVar13 = 0;
    do {
      updateWheelTransform(this,iVar13,false);
      iVar13 = iVar13 + 1;
    } while (iVar13 < (this->m_wheelInfo).m_size);
  }
  pbVar11 = this->m_chassisBody;
  fVar16 = (pbVar11->m_linearVelocity).m_floats[0];
  fVar1 = (pbVar11->m_linearVelocity).m_floats[1];
  fVar2 = (pbVar11->m_linearVelocity).m_floats[2];
  fVar16 = fVar2 * fVar2 + fVar16 * fVar16 + fVar1 * fVar1;
  if (fVar16 < 0.0) {
    fVar16 = sqrtf(fVar16);
  }
  else {
    fVar16 = SQRT(fVar16);
  }
  deltaTime = fVar16 * 3.6;
  this->m_currentVehicleSpeedKmHour = deltaTime;
  pbVar11 = this->m_chassisBody;
  iVar13 = this->m_indexForwardAxis;
  if ((&(pbVar11->super_btCollisionObject).m_worldTransform.m_origin)[-1].m_floats[iVar13] *
      (pbVar11->m_linearVelocity).m_floats[2] +
      (pbVar11->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[iVar13] *
      (pbVar11->m_linearVelocity).m_floats[0] +
      (&(pbVar11->super_btCollisionObject).m_worldTransform.m_origin)[-2].m_floats[iVar13] *
      (pbVar11->m_linearVelocity).m_floats[1] < 0.0) {
    deltaTime = -deltaTime;
    this->m_currentVehicleSpeedKmHour = deltaTime;
  }
  if (0 < (this->m_wheelInfo).m_size) {
    lVar14 = 0;
    lVar15 = 0;
    do {
      deltaTime = rayCast(this,(btWheelInfo *)
                               ((long)(((this->m_wheelInfo).m_data)->m_raycastInfo).
                                      m_contactNormalWS.m_floats + lVar14));
      lVar15 = lVar15 + 1;
      lVar14 = lVar14 + 0x128;
    } while (lVar15 < (this->m_wheelInfo).m_size);
  }
  updateSuspension(this,deltaTime);
  if (0 < (this->m_wheelInfo).m_size) {
    lVar14 = 0;
    lVar15 = 0;
    do {
      pbVar12 = (this->m_wheelInfo).m_data;
      fVar16 = *(float *)((long)(&pbVar12->m_wheelAxleCS + 3) + lVar14 + 0xc);
      fVar1 = *(float *)((long)(&pbVar12->m_wheelAxleCS + 6) + lVar14);
      if (fVar1 <= fVar16) {
        fVar16 = fVar1;
      }
      uVar9 = *(undefined8 *)((long)(pbVar12->m_raycastInfo).m_contactNormalWS.m_floats + lVar14);
      local_40.m_floats[1] = fVar16 * (float)((ulong)uVar9 >> 0x20) * step;
      local_40.m_floats[0] = fVar16 * (float)uVar9 * step;
      local_40.m_floats[2] =
           *(float *)((long)(pbVar12->m_raycastInfo).m_contactNormalWS.m_floats + lVar14 + 8) *
           fVar16 * step;
      local_40.m_floats[3] = 0.0;
      pbVar11 = this->m_chassisBody;
      uVar9 = *(undefined8 *)((long)(pbVar12->m_raycastInfo).m_contactPointWS.m_floats + lVar14);
      uVar10 = *(undefined8 *)(pbVar11->super_btCollisionObject).m_worldTransform.m_origin.m_floats;
      local_50.m_floats[1] = (float)((ulong)uVar9 >> 0x20) - (float)((ulong)uVar10 >> 0x20);
      local_50.m_floats[0] = (float)uVar9 - (float)uVar10;
      local_50.m_floats[2] =
           *(float *)((long)(pbVar12->m_raycastInfo).m_contactPointWS.m_floats + lVar14 + 8) -
           (pbVar11->super_btCollisionObject).m_worldTransform.m_origin.m_floats[2];
      local_50.m_floats[3] = 0.0;
      btRigidBody::applyImpulse(pbVar11,&local_40,&local_50);
      lVar15 = lVar15 + 1;
      lVar14 = lVar14 + 0x128;
    } while (lVar15 < (this->m_wheelInfo).m_size);
  }
  (*(this->super_btActionInterface)._vptr_btActionInterface[5])();
  lVar14 = (long)(this->m_wheelInfo).m_size;
  if (0 < lVar14) {
    pbVar11 = this->m_chassisBody;
    pbVar12 = (this->m_wheelInfo).m_data;
    iVar13 = this->m_indexForwardAxis;
    lVar15 = 0;
    do {
      if (*(bool *)((long)(&(pbVar12->m_raycastInfo).m_wheelAxleWS + 1) + lVar15) == true) {
        fVar19 = *(float *)((long)(pbVar12->m_raycastInfo).m_hardPointWS.m_floats + lVar15 + 4) -
                 (pbVar11->super_btCollisionObject).m_worldTransform.m_origin.m_floats[1];
        fVar17 = *(float *)((long)(pbVar12->m_raycastInfo).m_hardPointWS.m_floats + lVar15) -
                 (pbVar11->super_btCollisionObject).m_worldTransform.m_origin.m_floats[0];
        fVar16 = (pbVar11->m_angularVelocity).m_floats[0];
        fVar1 = (pbVar11->m_angularVelocity).m_floats[1];
        fVar2 = (pbVar11->m_angularVelocity).m_floats[2];
        fVar18 = *(float *)((long)(pbVar12->m_raycastInfo).m_hardPointWS.m_floats + lVar15 + 8) -
                 (pbVar11->super_btCollisionObject).m_worldTransform.m_origin.m_floats[2];
        fVar3 = (pbVar11->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[iVar13]
        ;
        fVar4 = (&(pbVar11->super_btCollisionObject).m_worldTransform.m_origin)[-2].m_floats[iVar13]
        ;
        fVar5 = (&(pbVar11->super_btCollisionObject).m_worldTransform.m_origin)[-1].m_floats[iVar13]
        ;
        fVar6 = *(float *)((long)(pbVar12->m_raycastInfo).m_contactNormalWS.m_floats + lVar15);
        fVar7 = *(float *)((long)(pbVar12->m_raycastInfo).m_contactNormalWS.m_floats + lVar15 + 4);
        fVar8 = *(float *)((long)(pbVar12->m_raycastInfo).m_contactNormalWS.m_floats + lVar15 + 8);
        fVar20 = fVar5 * fVar8 + fVar3 * fVar6 + fVar4 * fVar7;
        fVar16 = (((fVar5 - fVar20 * fVar8) *
                   ((fVar16 * fVar19 - fVar17 * fVar1) + (pbVar11->m_linearVelocity).m_floats[2]) +
                  (fVar4 - fVar7 * fVar20) *
                  ((fVar17 * fVar2 - fVar16 * fVar18) + (pbVar11->m_linearVelocity).m_floats[1]) +
                  (fVar3 - fVar6 * fVar20) *
                  ((fVar18 * fVar1 - fVar19 * fVar2) + (pbVar11->m_linearVelocity).m_floats[0])) *
                 step) / *(float *)((long)(&pbVar12->m_wheelAxleCS + 1) + lVar15 + 8);
        *(float *)((long)(&pbVar12->m_wheelAxleCS + 3) + lVar15 + 4) = fVar16;
        *(float *)((long)(&pbVar12->m_wheelAxleCS + 3) + lVar15) =
             fVar16 + *(float *)((long)(&pbVar12->m_wheelAxleCS + 3) + lVar15);
      }
      else {
        *(float *)((long)(&pbVar12->m_wheelAxleCS + 3) + lVar15) =
             *(float *)((long)(&pbVar12->m_wheelAxleCS + 3) + lVar15 + 4) +
             *(float *)((long)(&pbVar12->m_wheelAxleCS + 3) + lVar15);
      }
      *(float *)((long)(&pbVar12->m_wheelAxleCS + 3) + lVar15 + 4) =
           *(float *)((long)(&pbVar12->m_wheelAxleCS + 3) + lVar15 + 4) * 0.99;
      lVar15 = lVar15 + 0x128;
    } while (lVar14 * 0x128 - lVar15 != 0);
  }
  return;
}

Assistant:

void btRaycastVehicle::updateVehicle( btScalar step )
{
	{
		for (int i=0;i<getNumWheels();i++)
		{
			updateWheelTransform(i,false);
		}
	}


	m_currentVehicleSpeedKmHour = btScalar(3.6) * getRigidBody()->getLinearVelocity().length();
	
	const btTransform& chassisTrans = getChassisWorldTransform();

	btVector3 forwardW (
		chassisTrans.getBasis()[0][m_indexForwardAxis],
		chassisTrans.getBasis()[1][m_indexForwardAxis],
		chassisTrans.getBasis()[2][m_indexForwardAxis]);

	if (forwardW.dot(getRigidBody()->getLinearVelocity()) < btScalar(0.))
	{
		m_currentVehicleSpeedKmHour *= btScalar(-1.);
	}

	//
	// simulate suspension
	//
	
	int i=0;
	for (i=0;i<m_wheelInfo.size();i++)
	{
		//btScalar depth; 
		//depth = 
		rayCast( m_wheelInfo[i]);
	}

	updateSuspension(step);

	
	for (i=0;i<m_wheelInfo.size();i++)
	{
		//apply suspension force
		btWheelInfo& wheel = m_wheelInfo[i];
		
		btScalar suspensionForce = wheel.m_wheelsSuspensionForce;
		
		if (suspensionForce > wheel.m_maxSuspensionForce)
		{
			suspensionForce = wheel.m_maxSuspensionForce;
		}
		btVector3 impulse = wheel.m_raycastInfo.m_contactNormalWS * suspensionForce * step;
		btVector3 relpos = wheel.m_raycastInfo.m_contactPointWS - getRigidBody()->getCenterOfMassPosition();
		
		getRigidBody()->applyImpulse(impulse, relpos);
	
	}
	

	
	updateFriction( step);

	
	for (i=0;i<m_wheelInfo.size();i++)
	{
		btWheelInfo& wheel = m_wheelInfo[i];
		btVector3 relpos = wheel.m_raycastInfo.m_hardPointWS - getRigidBody()->getCenterOfMassPosition();
		btVector3 vel = getRigidBody()->getVelocityInLocalPoint( relpos );

		if (wheel.m_raycastInfo.m_isInContact)
		{
			const btTransform&	chassisWorldTransform = getChassisWorldTransform();

			btVector3 fwd (
				chassisWorldTransform.getBasis()[0][m_indexForwardAxis],
				chassisWorldTransform.getBasis()[1][m_indexForwardAxis],
				chassisWorldTransform.getBasis()[2][m_indexForwardAxis]);

			btScalar proj = fwd.dot(wheel.m_raycastInfo.m_contactNormalWS);
			fwd -= wheel.m_raycastInfo.m_contactNormalWS * proj;

			btScalar proj2 = fwd.dot(vel);
			
			wheel.m_deltaRotation = (proj2 * step) / (wheel.m_wheelsRadius);
			wheel.m_rotation += wheel.m_deltaRotation;

		} else
		{
			wheel.m_rotation += wheel.m_deltaRotation;
		}
		
		wheel.m_deltaRotation *= btScalar(0.99);//damping of rotation when not in contact

	}



}